

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator=
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  
  lVar1 = matrix->size_;
  if (lVar1 != this->size_) {
    this->size_ = lVar1;
    if (lVar1 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                    ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
    }
    pdVar3 = (double *)
             operator_new__(-(ulong)((ulong)(lVar1 * lVar1) >> 0x3d != 0) | lVar1 * lVar1 * 8);
    pdVar2 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar3;
    if (pdVar2 != (double *)0x0) {
      operator_delete__(pdVar2);
    }
  }
  lVar1 = this->size_;
  if (lVar1 != 0) {
    pdVar2 = (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
             .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    pdVar3 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    lVar4 = 0;
    do {
      pdVar3[lVar4] = pdVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar1 * lVar1 + (ulong)(lVar1 * lVar1 == 0) != lVar4);
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }